

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O3

UniValue * find_value(UniValue *obj,string *name)

{
  pointer pbVar1;
  pointer __s2;
  size_t __n;
  pointer pUVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  pbVar1 = (obj->keys).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(obj->keys).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar6 != 0) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    uVar7 = 0;
    uVar5 = 1;
    do {
      if ((pbVar1[uVar7]._M_string_length == __n) &&
         ((__n == 0 || (iVar4 = bcmp(pbVar1[uVar7]._M_dataplus._M_p,__s2,__n), iVar4 == 0)))) {
        pUVar2 = (obj->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = ((long)(obj->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pUVar2 >> 3) * 0x2e8ba2e8ba2e8ba3;
        if (uVar5 < uVar7 || uVar5 - uVar7 == 0) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar7);
        }
        return pUVar2 + uVar7;
      }
      bVar3 = uVar5 < (ulong)(lVar6 >> 5);
      uVar7 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar3);
  }
  return &NullUniValue;
}

Assistant:

const UniValue& find_value(const UniValue& obj, const std::string& name)
{
    for (unsigned int i = 0; i < obj.keys.size(); i++)
        if (obj.keys[i] == name)
            return obj.values.at(i);

    return NullUniValue;
}